

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::getRightNeighbour
               (GLfloat *texture_coordinates,GLuint face,GLuint offset,GLuint width,
               GLfloat *out_neighbour)

{
  float fVar1;
  float fVar2;
  GLfloat GVar3;
  float *pfVar4;
  GLfloat *pGVar5;
  float fVar6;
  GLfloat coord_z;
  GLfloat coord_y;
  GLfloat coord_x;
  GLfloat *z;
  GLfloat *y;
  GLfloat *x;
  GLfloat step;
  GLfloat *out_neighbour_local;
  GLuint width_local;
  GLuint offset_local;
  GLuint face_local;
  GLfloat *texture_coordinates_local;
  
  fVar6 = (float)offset / (float)width;
  pfVar4 = out_neighbour + 1;
  pGVar5 = out_neighbour + 2;
  fVar1 = *texture_coordinates;
  fVar2 = texture_coordinates[1];
  GVar3 = texture_coordinates[2];
  switch(face) {
  case 0:
    *out_neighbour = fVar1;
    *pfVar4 = fVar2 - fVar6;
    *pGVar5 = GVar3;
    break;
  case 1:
    *out_neighbour = fVar1;
    *pfVar4 = fVar2 + fVar6;
    *pGVar5 = GVar3;
    break;
  case 2:
    *out_neighbour = fVar1 + fVar6;
    *pfVar4 = fVar2;
    *pGVar5 = GVar3;
    break;
  case 3:
    *out_neighbour = fVar1 - fVar6;
    *pfVar4 = fVar2;
    *pGVar5 = GVar3;
    break;
  case 4:
    *out_neighbour = fVar1 + fVar6;
    *pfVar4 = fVar2;
    *pGVar5 = GVar3;
    break;
  case 5:
    *out_neighbour = fVar1 - fVar6;
    *pfVar4 = fVar2;
    *pGVar5 = GVar3;
  }
  return;
}

Assistant:

void getRightNeighbour(const glw::GLfloat* texture_coordinates, glw::GLuint face, glw::GLuint offset, glw::GLuint width,
					   glw::GLfloat* out_neighbour)
{
	const glw::GLfloat step = (float)offset / (float)width;

	glw::GLfloat& x = out_neighbour[0];
	glw::GLfloat& y = out_neighbour[1];
	glw::GLfloat& z = out_neighbour[2];

	const glw::GLfloat coord_x = texture_coordinates[0];
	const glw::GLfloat coord_y = texture_coordinates[1];
	const glw::GLfloat coord_z = texture_coordinates[2];

	switch (face)
	{
	case 0: // +X
		x = coord_x;
		y = coord_y - step;
		z = coord_z;
		break;
	case 1: // -X
		x = coord_x;
		y = coord_y + step;
		z = coord_z;
		break;
	case 2: // +Y
		x = coord_x + step;
		y = coord_y;
		z = coord_z;
		break;
	case 3: // -Y
		x = coord_x - step;
		y = coord_y;
		z = coord_z;
		break;
	case 4: // +Z
		x = coord_x + step;
		y = coord_y;
		z = coord_z;
		break;
	case 5: // -Z
		x = coord_x - step;
		y = coord_y;
		z = coord_z;
		break;
	}
}